

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O3

bool __thiscall
draco::GeometryAttribute::ConvertTypedValue<unsigned_short,int>
          (GeometryAttribute *this,AttributeValueIndex att_id,uint8_t out_num_components,
          int *out_value)

{
  pointer puVar1;
  pointer puVar2;
  undefined8 uVar3;
  byte bVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  
  uVar5 = *(uint *)&this->num_components_;
  bVar4 = out_num_components;
  if ((byte)uVar5 < out_num_components) {
    bVar4 = (byte)uVar5;
  }
  if (bVar4 != 0) {
    puVar1 = (this->buffer_->data_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = this->byte_offset_ + (ulong)att_id.value_ * this->byte_stride_;
    puVar2 = (this->buffer_->data_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar6 = 0;
    uVar7 = 0;
    do {
      if (puVar2 <= puVar1 + lVar6 + uVar3) {
        return false;
      }
      out_value[uVar7] = (uint)*(ushort *)(puVar1 + uVar7 * 2 + uVar3);
      uVar7 = uVar7 + 1;
      uVar5 = *(uint *)&this->num_components_;
      bVar4 = (byte)uVar5;
      if (out_num_components <= (byte)uVar5) {
        bVar4 = out_num_components;
      }
      lVar6 = lVar6 + 2;
    } while (uVar7 < bVar4);
  }
  if ((byte)uVar5 < out_num_components) {
    memset(out_value + (uVar5 & 0xff),0,(ulong)((uint)out_num_components + ~(uVar5 & 0xff)) * 4 + 4)
    ;
  }
  return true;
}

Assistant:

bool ConvertTypedValue(AttributeValueIndex att_id, uint8_t out_num_components,
                         OutT *out_value) const {
    const uint8_t *src_address = GetAddress(att_id);

    // Convert all components available in both the original and output formats.
    for (int i = 0; i < std::min(num_components_, out_num_components); ++i) {
      if (!IsAddressValid(src_address)) {
        return false;
      }
      const T in_value = *reinterpret_cast<const T *>(src_address);
      if (!ConvertComponentValue<T, OutT>(in_value, normalized_,
                                          out_value + i)) {
        return false;
      }
      src_address += sizeof(T);
    }
    // Fill empty data for unused output components if needed.
    for (int i = num_components_; i < out_num_components; ++i) {
      out_value[i] = static_cast<OutT>(0);
    }
    return true;
  }